

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void fftrecurs(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  ulong M_00;
  long lVar1;
  
  if (0xb < (ulong)M) {
    M_00 = M - 3;
    lVar1 = 0;
    do {
      fftrecurs(ioptr + (lVar1 << (M_00 & 0x3f)) * 2,M_00,Utbl,Ustride * 8,NDiffU,StageCnt + -1);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    StageCnt = 1;
    NDiffU = 1L << (M_00 & 0x3f);
  }
  bfstages(ioptr,M,Utbl,Ustride,NDiffU,StageCnt);
  return;
}

Assistant:

void fftrecurs(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/* recursive bfstages calls to maximize on chip cache efficiency */
long i1;
if (M <= MCACHE)  // fits on chip ?
	bfstages(ioptr, M, Utbl, Ustride, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
else{
	for (i1=0; i1<8; i1++){
		fftrecurs(&ioptr[i1*POW2(M-3)*2], M-3, Utbl, 8*Ustride, NDiffU, StageCnt-1);	/*  RADIX 8 Stages	*/
	}
	bfstages(ioptr, M, Utbl, Ustride, POW2(M-3), 1);	/*  RADIX 8 Stage	*/
}
}